

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsStatus.cpp
# Opt level: O2

string * highsStatusToString_abi_cxx11_(string *__return_storage_ptr__,HighsStatus status)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  if (status == kError) {
    pcVar2 = "Error";
    paVar1 = &local_b;
  }
  else if (status == kWarning) {
    pcVar2 = "Warning";
    paVar1 = &local_a;
  }
  else if (status == kOk) {
    pcVar2 = "OK";
    paVar1 = &local_9;
  }
  else {
    pcVar2 = "Unrecognised HiGHS status";
    paVar1 = &local_c;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string highsStatusToString(HighsStatus status) {
  switch (status) {
    case HighsStatus::kOk:
      return "OK";
    case HighsStatus::kWarning:
      return "Warning";
    case HighsStatus::kError:
      return "Error";
    default:
      assert(1 == 0);
      return "Unrecognised HiGHS status";
  }
}